

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_ldm_fillHashTable(ldmState_t *state,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  U64 lastHash;
  U64 startingHash;
  ldmParams_t *params_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ldmState_t *state_local;
  
  lastHash = ZSTD_rollingHash_compute(ip,(ulong)params->minMatchLength);
  ZSTD_ldm_fillLdmHashTable
            (state,lastHash,ip,iend + -(ulong)params->minMatchLength,(state->window).base,
             params->hashLog - params->bucketSizeLog,*params);
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* state, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U64 startingHash = ZSTD_rollingHash_compute(ip, params->minMatchLength);
    ZSTD_ldm_fillLdmHashTable(
        state, startingHash, ip, iend - params->minMatchLength, state->window.base,
        params->hashLog - params->bucketSizeLog,
        *params);
}